

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Math.cpp
# Opt level: O0

int nite::randomInt(int min,int max)

{
  int iVar1;
  result_type rVar2;
  result_type_conflict1 rVar3;
  uniform_int_distribution<int> local_13b0;
  uniform_int_distribution<int> uni;
  mt19937 rng;
  int max_local;
  int min_local;
  
  if (randomInt(int,int)::rd == '\0') {
    iVar1 = __cxa_guard_acquire(&randomInt(int,int)::rd);
    if (iVar1 != 0) {
      std::random_device::random_device(&randomInt::rd);
      __cxa_atexit(std::random_device::~random_device,&randomInt::rd,&__dso_handle);
      __cxa_guard_release(&randomInt(int,int)::rd);
    }
  }
  rVar2 = std::random_device::operator()(&randomInt::rd);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)&uni,(ulong)rVar2);
  std::uniform_int_distribution<int>::uniform_int_distribution(&local_13b0,min,max);
  rVar3 = std::uniform_int_distribution<int>::operator()
                    (&local_13b0,
                     (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                      *)&uni);
  return rVar3;
}

Assistant:

int nite::randomInt(int min, int max){
	static std::random_device rd;
	std::mt19937 rng(rd());
	std::uniform_int_distribution<int> uni(min,max);
	return uni(rng);
}